

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  string_view __x;
  string_view __y;
  FieldDescriptor *f2_local;
  FieldDescriptor *f1_local;
  FieldDescriptorCompare *this_local;
  
  if (f1 == (FieldDescriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else if (f2 == (FieldDescriptor *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    __x = FieldDescriptor::full_name(f1);
    __y = FieldDescriptor::full_name(f2);
    this_local._7_1_ = std::operator<(__x,__y);
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if (f1 == nullptr) {
      return false;
    }
    if (f2 == nullptr) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }